

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O3

FT_Bool tt_check_trickyness(FT_Face face)

{
  char *__haystack;
  code *pcVar1;
  FT_Stream stream;
  byte bVar2;
  int iVar3;
  FT_Error FVar4;
  char *pcVar5;
  FT_ULong FVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  bool bVar14;
  int local_c8 [26];
  FT_Face local_60;
  ulong local_58;
  undefined8 local_50;
  ulong local_48;
  long local_40;
  FT_Stream local_38;
  
  if (face == (FT_Face)0x0) {
    return '\0';
  }
  __haystack = face->family_name;
  if (__haystack != (char *)0x0) {
    lVar10 = 0;
    do {
      pcVar5 = strstr(__haystack,&tt_check_trickyness_family_trick_names + lVar10);
      if (pcVar5 != (char *)0x0) {
        return '\x01';
      }
      lVar10 = lVar10 + 0x14;
    } while (lVar10 != 0x1cc);
  }
  local_c8[0x14] = 0;
  local_c8[0x15] = 0;
  local_c8[0x16] = 0;
  local_c8[0x17] = 0;
  local_c8[0x10] = 0;
  local_c8[0x11] = 0;
  local_c8[0x12] = 0;
  local_c8[0x13] = 0;
  local_c8[0xc] = 0;
  local_c8[0xd] = 0;
  local_c8[0xe] = 0;
  local_c8[0xf] = 0;
  local_c8[8] = 0;
  local_c8[9] = 0;
  local_c8[10] = 0;
  local_c8[0xb] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[0x18] = 0;
  local_c8[0x19] = 0;
  uVar8 = (ulong)*(ushort *)&face[1].family_name;
  if (*(ushort *)&face[1].family_name == 0) {
    bVar14 = true;
  }
  else {
    uVar11 = 0;
    local_50 = 0;
    do {
      lVar12 = uVar11 * 0x20;
      lVar10 = *(long *)(face[1].style_name + lVar12);
      if (lVar10 == 0x63767420) {
        local_50 = CONCAT71((int7)(uVar8 >> 8),1);
        iVar3 = 0;
LAB_0022e774:
        uVar8 = (ulong)(uint)(iVar3 << 4);
        lVar10 = 0;
        uVar7 = 0;
        local_48 = uVar8;
        local_40 = lVar12;
        do {
          if (*(long *)(face[1].style_name + lVar12 + 0x18) ==
              *(long *)(tt_check_trickyness_sfnt_ids_sfnt_id + uVar8 + 8 + lVar10 * 0x30)) {
            if (uVar7 == 0) {
              pcVar1 = (code *)face[3].generic.data;
              if (pcVar1 == (code *)0x0) {
                uVar7 = 0;
              }
              else {
                iVar3 = (*pcVar1)(face,*(undefined8 *)(face[1].style_name + local_40),face->stream,0
                                 );
                uVar7 = 0;
                lVar12 = local_40;
                uVar8 = local_48;
                if (iVar3 == 0) {
                  stream = face->stream;
                  uVar8 = *(ulong *)(face[1].style_name + local_40 + 0x18);
                  local_58 = uVar11;
                  FVar4 = FT_Stream_EnterFrame(stream,uVar8);
                  if (FVar4 == 0) {
                    uVar9 = 0;
                    local_38 = stream;
                    if (3 < uVar8) {
                      uVar9 = 0;
                      do {
                        FVar6 = FT_Stream_GetULong(local_38);
                        uVar9 = uVar9 + (int)FVar6;
                        uVar8 = uVar8 - 4;
                      } while (3 < uVar8);
                    }
                    local_60 = face;
                    if (uVar8 != 0) {
                      bVar13 = 0x18;
                      do {
                        bVar2 = FT_Stream_GetChar(local_38);
                        uVar9 = uVar9 + ((uint)bVar2 << (bVar13 & 0x1f));
                        bVar13 = bVar13 - 8;
                        uVar8 = uVar8 - 1;
                      } while (uVar8 != 0);
                    }
                    FT_Stream_ExitFrame(local_38);
                    uVar7 = (ulong)uVar9;
                    uVar11 = local_58;
                    lVar12 = local_40;
                    uVar8 = local_48;
                    face = local_60;
                  }
                  else {
                    uVar7 = 0;
                    uVar11 = local_58;
                    lVar12 = local_40;
                    uVar8 = local_48;
                  }
                }
              }
            }
            iVar3 = local_c8[lVar10];
            if (*(ulong *)(tt_check_trickyness_sfnt_ids_sfnt_id + uVar8 + lVar10 * 0x30) == uVar7) {
              iVar3 = iVar3 + 1;
              local_c8[lVar10] = iVar3;
            }
            if (iVar3 == 3) {
              return '\x01';
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x1a);
        uVar8 = (ulong)*(ushort *)&face[1].family_name;
      }
      else {
        if (lVar10 == 0x70726570) {
          iVar3 = 2;
          goto LAB_0022e774;
        }
        if (lVar10 == 0x6670676d) {
          iVar3 = 1;
          goto LAB_0022e774;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar8);
    bVar14 = (char)local_50 == '\0';
  }
  uVar8 = 0xfffffffffffffff3;
  while( true ) {
    iVar3 = local_c8[uVar8 + 0xd];
    if ((bool)(uVar8 < 0xc & bVar14)) {
      iVar3 = iVar3 + 1;
      local_c8[uVar8 + 0xd] = iVar3;
    }
    if (iVar3 == 3) break;
    uVar8 = uVar8 + 1;
    if (uVar8 == 0xd) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static FT_Bool
  tt_check_trickyness( FT_Face  face )
  {
    if ( !face )
      return FALSE;

    /* For first, check the face name for quick check. */
    if ( face->family_name                               &&
         tt_check_trickyness_family( face->family_name ) )
      return TRUE;

    /* Type42 fonts may lack `name' tables, we thus try to identify */
    /* tricky fonts by checking the checksums of Type42-persistent  */
    /* sfnt tables (`cvt', `fpgm', and `prep').                     */
    if ( tt_check_trickyness_sfnt_ids( (TT_Face)face ) )
      return TRUE;

    return FALSE;
  }